

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_serialize_field
          (t_javame_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  ostream *poVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  string local_130;
  undefined1 local_109;
  string local_108;
  t_base local_e4;
  undefined1 local_e0 [4];
  t_base tbase;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_struct *local_30;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  type = (t_type *)prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_30 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
        if ((uVar3 & 1) == 0) {
          uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar7 = std::__cxx11::string::c_str();
            t_field::get_name_abi_cxx11_((t_field *)prefix_local);
            uVar8 = std::__cxx11::string::c_str();
            type_name_abi_cxx11_(&local_130,this,&local_30->super_t_type,false,false,false);
            uVar9 = std::__cxx11::string::c_str();
            printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",uVar7,uVar8,uVar9);
            std::__cxx11::string::~string((string *)&local_130);
          }
          else {
            psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,prefix,psVar5);
            poVar6 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
            std::operator<<(poVar6,"oprot.");
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
            if ((uVar3 & 1) == 0) {
              uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
              if ((uVar3 & 1) != 0) {
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI32(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
              }
            }
            else {
              local_e4 = t_base_type::get_base((t_base_type *)local_30);
              switch(local_e4) {
              case TYPE_VOID:
                pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e0);
                __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              case TYPE_STRING:
                uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[7])();
                if ((uVar3 & 1) == 0) {
                  poVar6 = std::operator<<((ostream *)tfield_local,"writeString(");
                  poVar6 = std::operator<<(poVar6,(string *)local_e0);
                  std::operator<<(poVar6,");");
                }
                else {
                  poVar6 = std::operator<<((ostream *)tfield_local,"writeBinary(");
                  poVar6 = std::operator<<(poVar6,(string *)local_e0);
                  std::operator<<(poVar6,");");
                }
                break;
              case TYPE_BOOL:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeBool(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I8:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeByte(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I16:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI16(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I32:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI32(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_I64:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeI64(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              case TYPE_DOUBLE:
                poVar6 = std::operator<<((ostream *)tfield_local,"writeDouble(");
                poVar6 = std::operator<<(poVar6,(string *)local_e0);
                std::operator<<(poVar6,");");
                break;
              default:
                local_109 = 1;
                auVar10 = __cxa_allocate_exception(0x20);
                t_base_type::t_base_name_abi_cxx11_
                          (&local_108,(t_base_type *)(ulong)local_e4,auVar10._8_4_);
                std::operator+(auVar10._0_8_,"compiler error: no Java name for base type ",
                               &local_108);
                local_109 = 0;
                __cxa_throw(auVar10._0_8_,&std::__cxx11::string::typeinfo,
                            std::__cxx11::string::~string);
              }
            }
            std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_e0);
          }
        }
        else {
          poVar6 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          poVar6 = std::operator<<(poVar6,"oprot.writeI32(");
          psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (name.field_2._M_local_buf + 8),prefix,psVar5);
          poVar6 = std::operator<<(poVar6,(string *)(name.field_2._M_local_buf + 8));
          poVar6 = std::operator<<(poVar6,".getValue());");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        }
      }
      else {
        psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
        std::operator+(&local_a0,prefix,psVar5);
        generate_serialize_container(this,(ostream *)ptVar2,&ptVar1->super_t_type,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
      std::operator+(&local_80,prefix,psVar5);
      generate_serialize_struct(this,(ostream *)ptVar2,ptVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    return;
  }
  local_5d = 1;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_50,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_50,psVar5);
  local_5d = 0;
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_javame_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_enum()) {
    indent(out) << "oprot.writeI32(" << prefix + tfield->get_name() << ".getValue());" << endl;
  } else if (type->is_base_type()) {
    string name = prefix + tfield->get_name();
    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no Java name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}